

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search_utils.h
# Opt level: O0

_Bool is_gradient_caching_for_hog_enabled(AV1_COMP *cpi)

{
  int iVar1;
  long in_RDI;
  SPEED_FEATURES *sf;
  undefined1 local_12;
  undefined1 local_11;
  
  iVar1 = frame_is_intra_only((AV1_COMMON *)(in_RDI + 0x3bf80));
  local_11 = false;
  if (((iVar1 != 0) && (local_11 = false, *(int *)(in_RDI + 0x60cb0) == 0)) &&
     (local_11 = false, *(char *)(in_RDI + 0x60950) == '\0')) {
    local_12 = true;
    if (*(int *)(in_RDI + 0x60b88) == 0) {
      local_12 = *(int *)(in_RDI + 0x60b8c) != 0;
    }
    local_11 = local_12;
  }
  return local_11;
}

Assistant:

static inline bool is_gradient_caching_for_hog_enabled(
    const AV1_COMP *const cpi) {
  const SPEED_FEATURES *const sf = &cpi->sf;
  return frame_is_intra_only(&cpi->common) && !sf->rt_sf.use_nonrd_pick_mode &&
         (sf->part_sf.partition_search_type == SEARCH_PARTITION) &&
         (sf->intra_sf.intra_pruning_with_hog ||
          sf->intra_sf.chroma_intra_pruning_with_hog);
}